

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

bool __thiscall
basist::basisu_transcoder::get_userdata
          (basisu_transcoder *this,void *pData,uint32_t data_size,uint32_t *userdata0,
          uint32_t *userdata1)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  void *in_RDI;
  uint32_t *in_R8;
  basis_file_header *pHeader;
  undefined4 in_stack_ffffffffffffffe0;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = validate_header_quick
                    ((basisu_transcoder *)
                     CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI,
                     (uint32_t)((ulong)in_RSI >> 0x20));
  if (bVar1) {
    uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int
                      ((packed_uint<4U> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
    *in_RCX = uVar2;
    uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int
                      ((packed_uint<4U> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
    *in_R8 = uVar2;
  }
  return bVar1;
}

Assistant:

bool basisu_transcoder::get_userdata(const void* pData, uint32_t data_size, uint32_t& userdata0, uint32_t& userdata1) const
	{
		if (!validate_header_quick(pData, data_size))
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::get_userdata: header validation failed\n");
			return false;
		}

		const basis_file_header* pHeader = static_cast<const basis_file_header*>(pData);

		userdata0 = pHeader->m_userdata0;
		userdata1 = pHeader->m_userdata1;
		return true;
	}